

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O3

uchar * pstore::varint::encode<unsigned_char*>(uint64_t x,uchar *out)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = bit_count::clz(x | 1);
  if (0xffffffc6 < uVar2 - 0x41) {
    uVar2 = 0x3f - uVar2;
    if (0x37 < uVar2) {
      assert_failed("bytes < 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/varint.hpp"
                    ,0x5c);
    }
    cVar1 = (char)((uVar2 & 0xff) * 0x25 >> 8);
    bVar3 = (byte)(((byte)((char)uVar2 - cVar1) >> 1) + cVar1) >> 2;
    x = x * 2 + 1 << bVar3;
    switch(bVar3) {
    case 6:
switchD_00116fa2_caseD_6:
      *out = (uchar)x;
      out = out + 1;
      x = x >> 8;
    case 5:
      *out = (uchar)x;
      out = out + 1;
      x = x >> 8;
    case 4:
      *out = (uchar)x;
      out = out + 1;
      x = x >> 8;
    case 3:
      *out = (uchar)x;
      out = out + 1;
      x = x >> 8;
    case 2:
      *out = (uchar)x;
      out = out + 1;
      x = x >> 8;
    case 1:
      *out = (uchar)x;
      out = out + 1;
      x = x >> 8;
    default:
      *out = (uchar)x;
      return out + 1;
    case 7:
      goto switchD_00116fa2_caseD_7;
    }
  }
  *out = '\0';
  out = out + 1;
switchD_00116fa2_caseD_7:
  *out = (uchar)x;
  out = out + 1;
  x = x >> 8;
  goto switchD_00116fa2_caseD_6;
}

Assistant:

OutputIterator encode (std::uint64_t x, OutputIterator out) {
            unsigned const bits = 64U - bit_count::clz (x | 1U);
            unsigned bytes;
            if (bits > 56U) {
                bytes = 8U;
                *(out++) = 0U;
            } else {
                bytes = (bits - 1U) / 7U + 1U;
                // Encode the number of bytes in the low bits of the value itself.
                x = (2U * x + 1U) << (bytes - 1U);
            }
            PSTORE_ASSERT (bytes < 9);
            // clang-format off
            switch (bytes) {
            // NOLINTNEXTLINE(bugprone-branch-clone)
            case 8: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 7: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 6: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 5: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 4: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 3: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 2: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            default:
                *(out++) = x & 0xFFU;
            }
            // clang-format on
            return out;
        }